

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

bool verifyResults(int numIterations,uint seed)

{
  result_type_conflict rVar1;
  ostream *poVar2;
  size_t siglen;
  uchar *sig;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  int iVar3;
  uchar *in_R8;
  size_t in_R9;
  long lVar4;
  default_random_engine rnd;
  SvdVerifier<SingularSvd> singularVerifier;
  double elements [3000];
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_5e68;
  SvdVerifier<SingularSvd> local_5e60;
  uniform_real_distribution<double> local_5e08;
  EVP_PKEY_CTX local_5df8 [24008];
  
  SvdVerifier<SingularSvd>::SvdVerifier(&local_5e60);
  iVar3 = 0;
  siglen = 0x7fffffff;
  sig = (uchar *)(ulong)(seed % 0x7fffffff + (uint)(seed % 0x7fffffff == 0));
  local_5e08._M_param._M_a = -10.0;
  local_5e08._M_param._M_b = 10.0;
  if (numIterations < 1) {
    numIterations = 0;
  }
  local_5e68._M_x = (unsigned_long)sig;
  for (; iVar3 != numIterations; iVar3 = iVar3 + 1) {
    for (lVar4 = 0; (int)lVar4 != 3000; lVar4 = lVar4 + 1) {
      rVar1 = std::uniform_real_distribution<double>::operator()(&local_5e08,&local_5e68);
      *(result_type_conflict *)(local_5df8 + lVar4 * 8) = rVar1;
      sig = extraout_RDX;
    }
    SvdVerifier<SingularSvd>::verify(&local_5e60,local_5df8,sig,siglen,in_R8,in_R9);
    sig = extraout_RDX_00;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"singular");
  std::endl<char,std::char_traits<char>>(poVar2);
  SvdVerifier<SingularSvd>::printStatistics(&local_5e60);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::
  _Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
                  *)&local_5e60);
  return (local_5e60.numOrthonormalUErrors == 0 && local_5e60.numReconstructionErrors == 0) &&
         local_5e60.numOrthonormalVErrors == 0;
}

Assistant:

bool verifyResults(int numIterations, unsigned int seed) {
	SvdVerifier< SingularSvd > singularVerifier;
#ifdef ENABLE_EIGEN
	SvdVerifier< EigenSvd > eigenVerifier;
#endif
#ifdef ENABLE_ARMADILLO
	SvdVerifier< ArmadilloSvd > armadilloVerifier;
#endif
	std::default_random_engine rnd(seed);
	std::uniform_real_distribution< double > dist(MIN_VALUE, MAX_VALUE);
	double elements[M * N];
	for (int n = 0; n < numIterations; ++n) {
		std::generate_n(elements, M * N, [&rnd, &dist]() {
			return dist(rnd);
		});
		singularVerifier.verify(elements);
#ifdef ENABLE_EIGEN
		eigenVerifier.verify(elements);
		eigenVerifier.compareSingularValues(
			singularVerifier.getAlgorithm().getS());
#endif
#ifdef ENABLE_ARMADILLO
		armadilloVerifier.verify(elements);
		armadilloVerifier.compareSingularValues(
			singularVerifier.getAlgorithm().getS());
#endif
	}
	// shows statistics
	std::cout << "singular" << std::endl;
	singularVerifier.printStatistics();
	std::cout << std::endl;
#ifdef ENABLE_EIGEN
	std::cout << "Eigen" << std::endl;
	eigenVerifier.printStatistics();
	std::cout << std::endl;
#endif
#ifdef ENABLE_ARMADILLO
	std::cout << "Armadillo" << std::endl;
	armadilloVerifier.printStatistics();
	std::cout << std::endl;
#endif
	return singularVerifier.isVerified();
}